

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdf5_utils.cxx
# Opt level: O0

bool trento::hdf5::filename_is_hdf5(path *path)

{
  bool bVar1;
  path *__val;
  const_iterator __last;
  initializer_list<const_char_*> *this;
  initializer_list<const_char_*> *piVar2;
  char **result;
  initializer_list<const_char_*> hdf5_exts;
  initializer_list<const_char_*> *in_stack_ffffffffffffff50;
  path *in_stack_ffffffffffffff70;
  char **__first;
  char *local_70 [4];
  initializer_list<const_char_*> *local_50;
  char *local_48;
  char *pcStack_40;
  char *pcStack_38;
  char *pcStack_30;
  initializer_list<const_char_*> local_20;
  bool local_1;
  
  bVar1 = boost::filesystem::path::has_extension(in_stack_ffffffffffffff70);
  if (bVar1) {
    local_48 = ".hdf5";
    pcStack_40 = ".hdf";
    pcStack_38 = ".hd5";
    pcStack_30 = ".h5";
    local_20._M_array = &local_48;
    local_20._M_len = 4;
    __val = (path *)std::initializer_list<const_char_*>::begin(&local_20);
    __last = std::initializer_list<const_char_*>::end(in_stack_ffffffffffffff50);
    __first = local_70;
    boost::filesystem::path::extension();
    this = (initializer_list<const_char_*> *)
           std::find<char_const*const*,boost::filesystem::path>(__first,__last,__val);
    boost::filesystem::path::~path((path *)0x14da79);
    local_50 = this;
    piVar2 = (initializer_list<const_char_*> *)std::initializer_list<const_char_*>::end(this);
    local_1 = this != piVar2;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool filename_is_hdf5(const fs::path& path) {
  if (!path.has_extension())
    return false;

  auto hdf5_exts = {".hdf5", ".hdf", ".hd5", ".h5"};
  auto result = std::find(hdf5_exts.begin(), hdf5_exts.end(), path.extension());

  return result != hdf5_exts.end();
}